

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O1

uint8_t * __thiscall
icu_63::BMPSet::spanUTF8(BMPSet *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  int32_t lo;
  int32_t hi;
  bool bVar1;
  byte bVar2;
  int32_t iVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  byte *pbVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  byte *pbVar11;
  byte *pbVar12;
  uint uVar13;
  byte *local_38;
  
  pbVar11 = s + length;
  bVar6 = *s;
  if (-1 < (char)bVar6) {
    lVar4 = (long)length + -1;
    if (spanCondition == USET_SPAN_NOT_CONTAINED) {
      do {
        if (this->latin1Contains[bVar6] != '\0') {
          return s;
        }
        if (lVar4 == 0) {
          return pbVar11;
        }
        s = s + 1;
        bVar6 = *s;
        lVar4 = lVar4 + -1;
      } while (-1 < (char)bVar6);
    }
    else {
      do {
        if (this->latin1Contains[bVar6] == '\0') {
          return s;
        }
        if (lVar4 == 0) {
          return pbVar11;
        }
        s = s + 1;
        bVar6 = *s;
        lVar4 = lVar4 + -1;
      } while (-1 < (char)bVar6);
    }
    length = (int)pbVar11 - (int)s;
  }
  bVar6 = pbVar11[-1];
  uVar13 = (uint)(spanCondition != USET_SPAN_NOT_CONTAINED);
  pbVar7 = pbVar11;
  if ((char)bVar6 < '\0') {
    if (bVar6 < 0xc0) {
      if ((length < 2) || (bVar6 = pbVar11[-2], bVar6 < 0xe0)) {
        if ((-0x41 < (char)bVar6) || ((length < 3 || (pbVar11[-3] < 0xf0)))) goto LAB_0030e980;
        pbVar7 = pbVar11 + -3;
      }
      else {
        pbVar7 = pbVar11 + -2;
      }
    }
    else {
      pbVar7 = pbVar11 + -1;
    }
    if ((int)this->containsFFFD != uVar13) {
      pbVar11 = pbVar7;
    }
  }
LAB_0030e980:
  if (s < pbVar7) {
    bVar6 = this->containsFFFD;
    lo = this->list4kStarts[0x10];
    hi = this->list4kStarts[0x11];
LAB_0030e9a5:
    do {
      bVar2 = *s;
      if (-1 < (char)bVar2) {
        pbVar12 = s + 1;
        if (spanCondition == USET_SPAN_NOT_CONTAINED) {
          do {
            if (this->latin1Contains[bVar2] != '\0') goto LAB_0030ec23;
            if (pbVar12 == pbVar7) {
              return pbVar11;
            }
            bVar2 = *pbVar12;
            pbVar12 = pbVar12 + 1;
          } while (-1 < (char)bVar2);
        }
        else {
          do {
            if (this->latin1Contains[bVar2] == '\0') {
LAB_0030ec23:
              return pbVar12 + -1;
            }
            if (pbVar12 == pbVar7) {
              return pbVar11;
            }
            bVar2 = *pbVar12;
            pbVar12 = pbVar12 + 1;
          } while (-1 < (char)bVar2);
        }
        s = pbVar12 + -1;
      }
      pbVar12 = s + 1;
      if (0xdf < bVar2) {
        uVar5 = (ulong)*pbVar12 ^ 0x80;
        if (bVar2 < 0xf0) {
          if ((0x3f < (byte)uVar5) || (0x3f < (byte)(s[2] ^ 0x80))) {
LAB_0030ea8d:
            if ((int)(char)bVar6 != uVar13) {
              return s;
            }
            goto LAB_0030ea96;
          }
          uVar9 = this->bmpBlockBits[uVar5] >> (bVar2 & 0xf) & 0x10001;
          if (uVar9 < 2) {
            if (uVar9 == uVar13) {
LAB_0030ec00:
              pbVar12 = s + 3;
              bVar1 = true;
              s = local_38;
            }
            else {
              bVar1 = false;
            }
          }
          else {
            uVar9 = bVar2 & 0xf;
            iVar3 = findCodePoint(this,uVar9 << 0xc | s[2] ^ 0x80 | (int)uVar5 << 6,
                                  this->list4kStarts[uVar9],this->list4kStarts[(ulong)uVar9 + 1]);
            if ((((byte)iVar3 ^ spanCondition != USET_SPAN_NOT_CONTAINED) & 1) == 0)
            goto LAB_0030ec00;
            bVar1 = false;
          }
          local_38 = s;
          if (!bVar1) {
            return s;
          }
        }
        else {
          if (((0x3f < (byte)uVar5) || (0x3f < (byte)(s[2] ^ 0x80))) || (0x3f < (byte)(s[3] ^ 0x80))
             ) goto LAB_0030ea8d;
          iVar8 = (uint)bVar2 * 0x40000;
          iVar10 = (int)uVar5 * 0x1000;
          bVar2 = bVar6;
          if (iVar8 + iVar10 + 0xfc3f0000U < 0x100000) {
            iVar3 = findCodePoint(this,(s[2] ^ 0x80) << 6 | s[3] ^ 0x80 |
                                       iVar8 + iVar10 + 0xfc400000U,lo,hi);
            bVar2 = (byte)iVar3 & 1;
          }
          pbVar12 = s + 4;
          if ((int)(char)bVar2 != uVar13) {
            return s;
          }
        }
        s = pbVar12;
        if (pbVar7 <= s) {
          return pbVar11;
        }
        goto LAB_0030e9a5;
      }
      if ((bVar2 < 0xc0) || (0x3f < (byte)((ulong)*pbVar12 ^ 0x80))) goto LAB_0030ea8d;
      if ((((byte)(this->table7FF[(ulong)*pbVar12 ^ 0x80] >> (bVar2 & 0x1f)) ^
           spanCondition != USET_SPAN_NOT_CONTAINED) & 1) != 0) {
        return s;
      }
      pbVar12 = s + 2;
LAB_0030ea96:
      s = pbVar12;
    } while (s < pbVar7);
  }
  return pbVar11;
}

Assistant:

const uint8_t *
BMPSet::spanUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    const uint8_t *limit=s+length;
    uint8_t b=*s;
    if(U8_IS_SINGLE(b)) {
        // Initial all-ASCII span.
        if(spanCondition) {
            do {
                if(!latin1Contains[b] || ++s==limit) {
                    return s;
                }
                b=*s;
            } while(U8_IS_SINGLE(b));
        } else {
            do {
                if(latin1Contains[b] || ++s==limit) {
                    return s;
                }
                b=*s;
            } while(U8_IS_SINGLE(b));
        }
        length=(int32_t)(limit-s);
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    const uint8_t *limit0=limit;

    /*
     * Make sure that the last 1/2/3/4-byte sequence before limit is complete
     * or runs into a lead byte.
     * In the span loop compare s with limit only once
     * per multi-byte character.
     *
     * Give a trailing illegal sequence the same value as the result of contains(FFFD),
     * including it if that is part of the span, otherwise set limit0 to before
     * the truncated sequence.
     */
    b=*(limit-1);
    if((int8_t)b<0) {
        // b>=0x80: lead or trail byte
        if(b<0xc0) {
            // single trail byte, check for preceding 3- or 4-byte lead byte
            if(length>=2 && (b=*(limit-2))>=0xe0) {
                limit-=2;
                if(containsFFFD!=spanCondition) {
                    limit0=limit;
                }
            } else if(b<0xc0 && b>=0x80 && length>=3 && (b=*(limit-3))>=0xf0) {
                // 4-byte lead byte with only two trail bytes
                limit-=3;
                if(containsFFFD!=spanCondition) {
                    limit0=limit;
                }
            }
        } else {
            // lead byte with no trail bytes
            --limit;
            if(containsFFFD!=spanCondition) {
                limit0=limit;
            }
        }
    }

    uint8_t t1, t2, t3;

    while(s<limit) {
        b=*s;
        if(U8_IS_SINGLE(b)) {
            // ASCII
            if(spanCondition) {
                do {
                    if(!latin1Contains[b]) {
                        return s;
                    } else if(++s==limit) {
                        return limit0;
                    }
                    b=*s;
                } while(U8_IS_SINGLE(b));
            } else {
                do {
                    if(latin1Contains[b]) {
                        return s;
                    } else if(++s==limit) {
                        return limit0;
                    }
                    b=*s;
                } while(U8_IS_SINGLE(b));
            }
        }
        ++s;  // Advance past the lead byte.
        if(b>=0xe0) {
            if(b<0xf0) {
                if( /* handle U+0000..U+FFFF inline */
                    (t1=(uint8_t)(s[0]-0x80)) <= 0x3f &&
                    (t2=(uint8_t)(s[1]-0x80)) <= 0x3f
                ) {
                    b&=0xf;
                    uint32_t twoBits=(bmpBlockBits[t1]>>b)&0x10001;
                    if(twoBits<=1) {
                        // All 64 code points with this lead byte and middle trail byte
                        // are either in the set or not.
                        if(twoBits!=(uint32_t)spanCondition) {
                            return s-1;
                        }
                    } else {
                        // Look up the code point in its 4k block of code points.
                        UChar32 c=(b<<12)|(t1<<6)|t2;
                        if(containsSlow(c, list4kStarts[b], list4kStarts[b+1]) != spanCondition) {
                            return s-1;
                        }
                    }
                    s+=2;
                    continue;
                }
            } else if( /* handle U+10000..U+10FFFF inline */
                (t1=(uint8_t)(s[0]-0x80)) <= 0x3f &&
                (t2=(uint8_t)(s[1]-0x80)) <= 0x3f &&
                (t3=(uint8_t)(s[2]-0x80)) <= 0x3f
            ) {
                // Give an illegal sequence the same value as the result of contains(FFFD).
                UChar32 c=((UChar32)(b-0xf0)<<18)|((UChar32)t1<<12)|(t2<<6)|t3;
                if( (   (0x10000<=c && c<=0x10ffff) ?
                            containsSlow(c, list4kStarts[0x10], list4kStarts[0x11]) :
                            containsFFFD
                    ) != spanCondition
                ) {
                    return s-1;
                }
                s+=3;
                continue;
            }
        } else {
            if( /* handle U+0000..U+07FF inline */
                b>=0xc0 &&
                (t1=(uint8_t)(*s-0x80)) <= 0x3f
            ) {
                if((USetSpanCondition)((table7FF[t1]&((uint32_t)1<<(b&0x1f)))!=0) != spanCondition) {
                    return s-1;
                }
                ++s;
                continue;
            }
        }

        // Give an illegal sequence the same value as the result of contains(FFFD).
        // Handle each byte of an illegal sequence separately to simplify the code;
        // no need to optimize error handling.
        if(containsFFFD!=spanCondition) {
            return s-1;
        }
    }

    return limit0;
}